

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  REF_CELL *ppRVar5;
  uint unaff_R15D;
  
  ref_node = ref_grid->node;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    ppRVar5 = ref_grid->cell + 8;
  }
  else {
    ppRVar5 = ref_grid->cell + 3;
  }
  if (ref_node->max < 1) {
    uVar3 = 0;
  }
  else {
    pRVar1 = *ppRVar5;
    lVar4 = 0;
    bVar2 = 0;
    do {
      if ((-1 < ref_node->global[lVar4]) &&
         ((pRVar1->ref_adj->nnode <= lVar4 || (pRVar1->ref_adj->first[lVar4] == -1)))) {
        uVar3 = ref_node_location(ref_node,(REF_INT)lVar4);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x2e,"ref_validation_simplex_node",(ulong)uVar3,"location");
          unaff_R15D = uVar3;
        }
        bVar2 = 1;
        if (uVar3 != 0) {
          return unaff_R15D;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < ref_node->max);
    uVar3 = (uint)bVar2;
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_BOOL problem;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_cell, node)) {
      problem = REF_TRUE;
      RSS(ref_node_location(ref_node, node), "location");
    }
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}